

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_format(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  char *__s;
  char *pcVar5;
  char *pcVar6;
  char *s;
  size_t l;
  void *p;
  lua_Number n_1;
  lua_Integer n;
  char *pcStack_2088;
  int nb;
  char *buff;
  char local_2078 [2];
  char local_2076;
  int maxitem;
  char form [32];
  luaL_Buffer b;
  char *strfrmt_end;
  char *strfrmt;
  size_t sfl;
  int arg;
  int top;
  lua_State *L_local;
  
  _arg = L;
  sfl._4_4_ = lua_gettop(L);
  sfl._0_4_ = 1;
  pcVar2 = luaL_checklstring(_arg,1,(size_t *)&strfrmt);
  luaL_buffinit(_arg,(luaL_Buffer *)(form + 0x18));
  strfrmt_end = pcVar2;
  do {
    while( true ) {
      while( true ) {
        if (pcVar2 + (long)strfrmt <= strfrmt_end) {
          luaL_pushresult((luaL_Buffer *)(form + 0x18));
          return 1;
        }
        if (*strfrmt_end == '%') break;
        if (b.b <= b.size) {
          luaL_prepbuffsize((luaL_Buffer *)(form + 0x18),1);
        }
        *(char *)(form._24_8_ + b.size) = *strfrmt_end;
        b.size = b.size + 1;
        strfrmt_end = strfrmt_end + 1;
      }
      pcVar6 = strfrmt_end + 1;
      if (strfrmt_end[1] != '%') break;
      if (b.b <= b.size) {
        luaL_prepbuffsize((luaL_Buffer *)(form + 0x18),1);
      }
      strfrmt_end = strfrmt_end + 2;
      *(char *)(form._24_8_ + b.size) = *pcVar6;
      b.size = b.size + 1;
    }
    buff._4_4_ = 0x78;
    pcStack_2088 = luaL_prepbuffsize((luaL_Buffer *)(form + 0x18),0x78);
    n._4_4_ = 0;
    sfl._0_4_ = (int)sfl + 1;
    if (sfl._4_4_ < (int)sfl) {
      iVar1 = luaL_argerror(_arg,(int)sfl,"no value");
      return iVar1;
    }
    pcVar6 = scanformat(_arg,pcVar6,local_2078);
    strfrmt_end = pcVar6 + 1;
    switch(*pcVar6) {
    case 'A':
    case 'a':
      addlenmod(local_2078,"");
      memset(pcStack_2088,0xab,(long)buff._4_4_);
      pcVar6 = pcStack_2088;
      sVar4 = (size_t)buff._4_4_;
      luaL_checknumber(_arg,(int)sfl);
      n._4_4_ = snprintf(pcVar6,sVar4,local_2078);
      break;
    default:
      iVar1 = luaL_error(_arg,"invalid conversion \'%s\' to \'format\'",local_2078);
      return iVar1;
    case 'X':
    case 'd':
    case 'i':
    case 'o':
    case 'u':
    case 'x':
      n_1 = (lua_Number)luaL_checkinteger(_arg,(int)sfl);
      addlenmod(local_2078,"ll");
      memset(pcStack_2088,0xab,(long)buff._4_4_);
      n._4_4_ = snprintf(pcStack_2088,(long)buff._4_4_,local_2078,n_1);
      break;
    case 'c':
      memset(pcStack_2088,0xab,(long)buff._4_4_);
      pcVar6 = pcStack_2088;
      sVar4 = (size_t)buff._4_4_;
      uVar3 = luaL_checkinteger(_arg,(int)sfl);
      n._4_4_ = snprintf(pcVar6,sVar4,local_2078,uVar3 & 0xffffffff);
      break;
    case 'f':
      buff._4_4_ = 0x1a2;
      pcStack_2088 = luaL_prepbuffsize((luaL_Buffer *)(form + 0x18),0x1a2);
    case 'E':
    case 'G':
    case 'e':
    case 'g':
      p = (void *)luaL_checknumber(_arg,(int)sfl);
      addlenmod(local_2078,"");
      memset(pcStack_2088,0xab,(long)buff._4_4_);
      n._4_4_ = snprintf(pcStack_2088,(long)buff._4_4_,local_2078,p);
      break;
    case 'p':
      l = (size_t)lua_topointer(_arg,(int)sfl);
      if ((void *)l == (void *)0x0) {
        l = (size_t)anon_var_dwarf_117f7;
        sVar4 = strlen(local_2078);
        local_2078[sVar4 - 1] = 's';
      }
      memset(pcStack_2088,0xab,(long)buff._4_4_);
      n._4_4_ = snprintf(pcStack_2088,(long)buff._4_4_,local_2078,l);
      break;
    case 'q':
      if (local_2076 != '\0') {
        iVar1 = luaL_error(_arg,"specifier \'%%q\' cannot have modifiers");
        return iVar1;
      }
      addliteral(_arg,(luaL_Buffer *)(form + 0x18),(int)sfl);
      break;
    case 's':
      __s = luaL_tolstring(_arg,(int)sfl,(size_t *)&s);
      pcVar6 = s;
      if (local_2076 == '\0') {
        luaL_addvalue((luaL_Buffer *)(form + 0x18));
      }
      else {
        pcVar5 = (char *)strlen(__s);
        if (pcVar6 != pcVar5) {
          luaL_argerror(_arg,(int)sfl,"string contains zeros");
        }
        pcVar6 = strchr(local_2078,0x2e);
        if ((pcVar6 == (char *)0x0) && ((char *)0x63 < s)) {
          luaL_addvalue((luaL_Buffer *)(form + 0x18));
        }
        else {
          memset(pcStack_2088,0xab,(long)buff._4_4_);
          n._4_4_ = snprintf(pcStack_2088,(long)buff._4_4_,local_2078,__s);
          lua_settop(_arg,-2);
        }
      }
    }
    if (buff._4_4_ <= n._4_4_) {
      __assert_fail("nb < maxitem",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstrlib.c"
                    ,0x51d,"int str_format(lua_State *)");
    }
    b.size = (long)n._4_4_ + b.size;
  } while( true );
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      int maxitem = MAX_ITEM;
      char *buff = luaL_prepbuffsize(&b, maxitem);  /* to put formatted item */
      int nb = 0;  /* number of bytes in added item */
      if (++arg > top)
        return luaL_argerror(L, arg, "no value");
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          nb = l_sprintf(buff, maxitem, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
        case 'o': case 'u': case 'x': case 'X': {
          lua_Integer n = luaL_checkinteger(L, arg);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, maxitem, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'f':
          maxitem = MAX_ITEMF;  /* extra space for '%f' */
          buff = luaL_prepbuffsize(&b, maxitem);
          /* FALLTHROUGH */
        case 'e': case 'E': case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'p': {
          const void *p = lua_topointer(L, arg);
          if (p == NULL) {  /* avoid calling 'printf' with argument NULL */
            p = "(null)";  /* result */
            form[strlen(form) - 1] = 's';  /* format it as a string */
          }
          nb = l_sprintf(buff, maxitem, form, p);
          break;
        }
        case 'q': {
          if (form[2] != '\0')  /* modifiers? */
            return luaL_error(L, "specifier '%%q' cannot have modifiers");
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            if (!strchr(form, '.') && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, maxitem, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid conversion '%s' to 'format'", form);
        }
      }
      lua_assert(nb < maxitem);
      luaL_addsize(&b, nb);
    }
  }
  luaL_pushresult(&b);
  return 1;
}